

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O1

Aig_CMan_t * Aig_CManStart(int nIns,int nNodes,int nOuts)

{
  int iVar1;
  Aig_CMan_t *pAVar2;
  
  iVar1 = nNodes * 4 + nOuts * 2;
  pAVar2 = (Aig_CMan_t *)malloc((long)iVar1 + 0x28);
  pAVar2->nIns = 0;
  pAVar2->nNodes = 0;
  pAVar2->nOuts = 0;
  pAVar2->iNode = 0;
  pAVar2->iDiff0 = 0;
  pAVar2->iDiff1 = 0;
  pAVar2->pCur = (uchar *)0x0;
  pAVar2->iPrev = 0;
  pAVar2->nBytes = 0;
  pAVar2->nIns = nIns;
  pAVar2->nOuts = nOuts;
  pAVar2->nNodes = nNodes;
  pAVar2->nBytes = iVar1;
  pAVar2->iNode = nIns + 1;
  pAVar2->iPrev = -1;
  pAVar2->pCur = (uchar *)(pAVar2 + 1);
  return pAVar2;
}

Assistant:

Aig_CMan_t * Aig_CManStart( int nIns, int nNodes, int nOuts )
{
    Aig_CMan_t * p;
    p = (Aig_CMan_t *)ABC_ALLOC( char, sizeof(Aig_CMan_t) + 2*(2*nNodes + nOuts) );
    memset( p, 0, sizeof(Aig_CMan_t) );
    // set parameters
    p->nIns = nIns;
    p->nOuts = nOuts;
    p->nNodes = nNodes;
    p->nBytes = 2*(2*nNodes + nOuts);
    // prepare the manager
    p->iNode = 1 + p->nIns;
    p->iPrev = -1;
    p->pCur = p->Data;
    return p;
}